

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_bind_protocol(lws *wsi,lws_protocols *p,char *reason)

{
  lws_vhost *plVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  lws_protocols *plVar5;
  int n;
  
  plVar5 = wsi->vhost->protocols;
  uVar4 = *(ulong *)&wsi->field_0x2dc;
  if ((uVar4 >> 0x22 & 1) != 0 && wsi->protocol != (lws_protocols *)0x0) {
    (*wsi->protocol->callback)
              (wsi,(lws_callback_reasons)
                   *(undefined2 *)
                    ((long)wsi->role_ops->protocol_unbind_cb + (ulong)(wsi->wsistate >> 0x1c & 2)),
               wsi->user_space,reason,0);
    uVar4 = *(ulong *)&wsi->field_0x2dc & 0xfffffffbffffffff;
    *(ulong *)&wsi->field_0x2dc = uVar4;
  }
  if (((uint)uVar4 >> 0xb & 1) == 0) {
    lws_realloc(wsi->user_space,0,"free");
    wsi->user_space = (void *)0x0;
  }
  lws_same_vh_protocol_remove(wsi);
  wsi->protocol = p;
  if (p != (lws_protocols *)0x0) {
    iVar2 = lws_ensure_user_space(wsi);
    if (iVar2 != 0) {
      return 1;
    }
    plVar1 = wsi->vhost;
    iVar2 = plVar1->count_protocols;
    if ((plVar5 < p) && (p < plVar5 + iVar2)) {
      n = (int)(((long)p - (long)plVar5) / 0x38);
LAB_00116550:
      lws_same_vh_protocol_insert(wsi,n);
    }
    else {
      for (n = 0; iVar2 != n; n = n + 1) {
        if (((p->name != (char *)0x0) && (plVar5->name != (char *)0x0)) &&
           (iVar3 = strcmp(p->name,plVar5->name), iVar3 == 0)) goto LAB_00116550;
        plVar5 = plVar5 + 1;
      }
      _lws_log(1,"%s: %p is not in vhost \'%s\' protocols list\n","lws_bind_protocol",p,plVar1->name
              );
    }
    iVar2 = (*wsi->protocol->callback)
                      (wsi,(lws_callback_reasons)
                           *(undefined2 *)
                            ((long)wsi->role_ops->protocol_bind_cb +
                            (ulong)(wsi->wsistate >> 0x1c & 2)),wsi->user_space,(void *)0x0,0);
    if (iVar2 != 0) {
      return 1;
    }
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc | 0x400000000;
  }
  return 0;
}

Assistant:

int
lws_bind_protocol(struct lws *wsi, const struct lws_protocols *p,
		  const char *reason)
{
//	if (wsi->protocol == p)
//		return 0;
	const struct lws_protocols *vp = wsi->vhost->protocols, *vpo;

	if (wsi->protocol && wsi->protocol_bind_balance) {
		wsi->protocol->callback(wsi,
		       wsi->role_ops->protocol_unbind_cb[!!lwsi_role_server(wsi)],
					wsi->user_space, (void *)reason, 0);
		wsi->protocol_bind_balance = 0;
	}
	if (!wsi->user_space_externally_allocated)
		lws_free_set_NULL(wsi->user_space);

	lws_same_vh_protocol_remove(wsi);

	wsi->protocol = p;
	if (!p)
		return 0;

	if (lws_ensure_user_space(wsi))
		return 1;

	if (p > vp && p < &vp[wsi->vhost->count_protocols])
		lws_same_vh_protocol_insert(wsi, (int)(p - vp));
	else {
		int n = wsi->vhost->count_protocols;
		int hit = 0;

		vpo = vp;

		while (n--) {
			if (p->name && vp->name && !strcmp(p->name, vp->name)) {
				hit = 1;
				lws_same_vh_protocol_insert(wsi, (int)(vp - vpo));
				break;
			}
			vp++;
		}
		if (!hit)
			lwsl_err("%s: %p is not in vhost '%s' protocols list\n",
				 __func__, p, wsi->vhost->name);
	}

	if (wsi->protocol->callback(wsi, wsi->role_ops->protocol_bind_cb[
				    !!lwsi_role_server(wsi)],
				    wsi->user_space, NULL, 0))
		return 1;

	wsi->protocol_bind_balance = 1;

	return 0;
}